

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O3

int mg_path_relationship_reversed_at(mg_path *path,uint32_t pos)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (pos < path->sequence_length >> 1) {
    uVar1 = (uint)((ulong)path->sequence[pos * 2] >> 0x3f);
  }
  return uVar1;
}

Assistant:

int mg_path_relationship_reversed_at(const mg_path *path, uint32_t pos) {
  if (pos < path->sequence_length / 2) {
    int64_t idx = path->sequence[2 * pos];
    if (idx < 0) {
      return 1;
    } else {
      return 0;
    }
  } else {
    return -1;
  }
}